

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verParse.c
# Opt level: O0

int Ver_ParseSkipComments(Ver_Man_t *pMan)

{
  Ver_Stream_t *p_00;
  char cVar1;
  int iVar2;
  char Symbol;
  Ver_Stream_t *p;
  Ver_Man_t *pMan_local;
  
  p_00 = pMan->pReader;
  Ver_StreamSkipChars(p_00," \t\n\r");
  iVar2 = Ver_StreamIsOkey(pMan->pReader);
  if (iVar2 == 0) {
    pMan_local._4_4_ = 1;
  }
  else {
    cVar1 = Ver_StreamScanChar(p_00);
    if (cVar1 == '/') {
      Ver_StreamPopChar(p_00);
      cVar1 = Ver_StreamScanChar(p_00);
      if (cVar1 == '/') {
        Ver_StreamSkipToChars(p_00,"\n");
        pMan_local._4_4_ = Ver_ParseSkipComments(pMan);
      }
      else if (cVar1 == '*') {
        Ver_StreamPopChar(p_00);
        do {
          Ver_StreamSkipToChars(p_00,"*");
          Ver_StreamPopChar(p_00);
          cVar1 = Ver_StreamScanChar(p_00);
        } while (cVar1 != '/');
        Ver_StreamPopChar(p_00);
        pMan_local._4_4_ = Ver_ParseSkipComments(pMan);
      }
      else {
        sprintf(pMan->sError,"Cannot parse after symbol \"/\".");
        Ver_ParsePrintErrorMessage(pMan);
        pMan_local._4_4_ = 0;
      }
    }
    else {
      pMan_local._4_4_ = 1;
    }
  }
  return pMan_local._4_4_;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Skips the comments of they are present.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Ver_ParseSkipComments( Ver_Man_t * pMan )
{
    Ver_Stream_t * p = pMan->pReader;
    char Symbol;
    // skip spaces
    Ver_StreamSkipChars( p, " \t\n\r" );
    if ( !Ver_StreamIsOkey(pMan->pReader) )
        return 1;
    // read the first symbol
    Symbol = Ver_StreamScanChar( p );
    if ( Symbol != '/' )
        return 1;
    Ver_StreamPopChar( p );
    // read the second symbol
    Symbol = Ver_StreamScanChar( p );
    if ( Symbol == '/' )
    { // skip till the end of line
        Ver_StreamSkipToChars( p, "\n" );
        return Ver_ParseSkipComments( pMan );
    }
    if ( Symbol == '*' )
    { // skip till the next occurrence of */
        Ver_StreamPopChar( p );
        do {
            Ver_StreamSkipToChars( p, "*" );
            Ver_StreamPopChar( p );
        } while ( Ver_StreamScanChar( p ) != '/' );
        Ver_StreamPopChar( p );
        return Ver_ParseSkipComments( pMan );
    }
    sprintf( pMan->sError, "Cannot parse after symbol \"/\"." );
    Ver_ParsePrintErrorMessage( pMan );
    return 0;
}